

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChVariablesNode.cpp
# Opt level: O2

void __thiscall
chrono::ChVariablesNode::MultiplyAndAdd
          (ChVariablesNode *this,ChVectorRef *result,ChVectorConstRef vect,double c_a)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  double dVar4;
  Scalar *pSVar5;
  CoeffReturnType CVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  
  dVar4 = c_a * this->mass;
  CVar6 = Eigen::
          DenseCoeffsBase<Eigen::Ref<const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0,_Eigen::InnerStride<1>_>,_0>
          ::operator()((DenseCoeffsBase<Eigen::Ref<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,_0>
                        *)vect,(long)(this->super_ChVariables).offset);
  pSVar5 = Eigen::
           DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0,_Eigen::InnerStride<1>_>,_1>
           ::operator()((DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,_1>
                         *)result,(long)(this->super_ChVariables).offset);
  auVar7._8_8_ = 0;
  auVar7._0_8_ = dVar4;
  auVar10._8_8_ = 0;
  auVar10._0_8_ = CVar6;
  auVar1._8_8_ = 0;
  auVar1._0_8_ = *pSVar5;
  auVar1 = vfmadd213sd_fma(auVar10,auVar7,auVar1);
  *pSVar5 = auVar1._0_8_;
  CVar6 = Eigen::
          DenseCoeffsBase<Eigen::Ref<const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0,_Eigen::InnerStride<1>_>,_0>
          ::operator()((DenseCoeffsBase<Eigen::Ref<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,_0>
                        *)vect,(long)(this->super_ChVariables).offset + 1);
  pSVar5 = Eigen::
           DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0,_Eigen::InnerStride<1>_>,_1>
           ::operator()((DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,_1>
                         *)result,(long)(this->super_ChVariables).offset + 1);
  auVar8._8_8_ = 0;
  auVar8._0_8_ = dVar4;
  auVar11._8_8_ = 0;
  auVar11._0_8_ = CVar6;
  auVar2._8_8_ = 0;
  auVar2._0_8_ = *pSVar5;
  auVar1 = vfmadd213sd_fma(auVar11,auVar8,auVar2);
  *pSVar5 = auVar1._0_8_;
  CVar6 = Eigen::
          DenseCoeffsBase<Eigen::Ref<const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0,_Eigen::InnerStride<1>_>,_0>
          ::operator()((DenseCoeffsBase<Eigen::Ref<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,_0>
                        *)vect,(long)(this->super_ChVariables).offset + 2);
  pSVar5 = Eigen::
           DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0,_Eigen::InnerStride<1>_>,_1>
           ::operator()((DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,_1>
                         *)result,(long)(this->super_ChVariables).offset + 2);
  auVar9._8_8_ = 0;
  auVar9._0_8_ = dVar4;
  auVar12._8_8_ = 0;
  auVar12._0_8_ = CVar6;
  auVar3._8_8_ = 0;
  auVar3._0_8_ = *pSVar5;
  auVar1 = vfmadd213sd_fma(auVar12,auVar9,auVar3);
  *pSVar5 = auVar1._0_8_;
  return;
}

Assistant:

void ChVariablesNode::MultiplyAndAdd(ChVectorRef result, ChVectorConstRef vect, const double c_a) const {
    // optimized unrolled operations
    double scaledmass = c_a * mass;
    result(this->offset) += scaledmass * vect(this->offset);
    result(this->offset + 1) += scaledmass * vect(this->offset + 1);
    result(this->offset + 2) += scaledmass * vect(this->offset + 2);
}